

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O3

void SuperSpread_Test_Speed<4u>(string *PATH)

{
  size_type *psVar1;
  char cVar2;
  int iVar3;
  long *plVar4;
  ostream *poVar5;
  Data<4U> *pDVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  long *plVar10;
  size_type *psVar11;
  long lVar12;
  double dVar13;
  Data<4U> to;
  Data<4U> from;
  int cnt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string file;
  WavingSketch<8U,_16U,_4U> sketch;
  ofstream out;
  Data<4U> local_3d0;
  Data<4U> local_3cc;
  double local_3c8;
  long *local_3c0;
  long local_3b8;
  long local_3b0;
  long lStack_3a8;
  string *local_3a0;
  int local_394;
  long *local_390 [2];
  long local_380 [2];
  long *local_370 [2];
  long local_360 [2];
  TLF<4U> local_350;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_3cc.str[0] = '\0';
  local_3cc.str[1] = '\0';
  local_3cc.str[2] = '\0';
  local_3cc.str[3] = '\0';
  local_3d0.str[0] = '\0';
  local_3d0.str[1] = '\0';
  local_3d0.str[2] = '\0';
  local_3d0.str[3] = '\0';
  local_370[0] = local_360;
  local_3a0 = PATH;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"caida","");
  local_390[0] = local_380;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_390,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)local_390);
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)local_390,(ulong)local_370[0]);
  plVar10 = plVar4 + 2;
  if ((long *)*plVar4 == plVar10) {
    local_3b0 = *plVar10;
    lStack_3a8 = plVar4[3];
    local_3c0 = &local_3b0;
  }
  else {
    local_3b0 = *plVar10;
    local_3c0 = (long *)*plVar4;
  }
  local_3b8 = plVar4[1];
  *plVar4 = (long)plVar10;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_3c0);
  psVar1 = &local_350.super_Abstract<4U>.name._M_string_length;
  psVar11 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar11) {
    local_350.super_Abstract<4U>.name._M_string_length = *psVar11;
    local_350.super_Abstract<4U>.name.field_2._M_allocated_capacity = plVar4[3];
    local_350.super_Abstract<4U>._vptr_Abstract = (_func_int **)psVar1;
  }
  else {
    local_350.super_Abstract<4U>.name._M_string_length = *psVar11;
    local_350.super_Abstract<4U>._vptr_Abstract = (_func_int **)*plVar4;
  }
  local_350.super_Abstract<4U>.name._M_dataplus._M_p = (pointer)plVar4[1];
  *plVar4 = (long)psVar11;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::ofstream::ofstream(&local_230,(string *)&local_350,_S_out);
  if (local_350.super_Abstract<4U>._vptr_Abstract != (_func_int **)psVar1) {
    operator_delete(local_350.super_Abstract<4U>._vptr_Abstract,
                    local_350.super_Abstract<4U>.name._M_string_length + 1);
  }
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0,local_3b0 + 1);
  }
  if (local_390[0] != local_380) {
    operator_delete(local_390[0],local_380[0] + 1);
  }
  iVar3 = 0;
  do {
    uVar9 = iVar3 * 100000 + 600000;
    local_3c8 = (double)(ulong)uVar9;
    uVar9 = uVar9 / 1000;
    printf("\x1b[0m\x1b[1;4;36m> Memory size: %dKB\n\x1b[0m",(ulong)uVar9);
    local_394 = iVar3;
    if (iVar3 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"MEM(KB)",7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"WavingSketch<8,1>",0x11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"TLF",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"OLF",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"opensketch",10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"SpreadSketch",0xc);
      cVar2 = (char)(ostream *)&local_230;
      std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
    }
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_230,uVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    WavingSketch<8U,_16U,_4U>::WavingSketch
              ((WavingSketch<8U,_16U,_4U> *)&local_350,SUB84(local_3c8,0),0x54,3);
    pDVar6 = read_standard_pair_data<4u>
                       ((local_3a0->_M_dataplus)._M_p,record_length,(int *)&local_3c0);
    lVar7 = std::chrono::_V2::system_clock::now();
    iVar3 = (int)local_3c0;
    if (9999999 < (int)local_3c0) {
      iVar3 = 10000000;
    }
    local_3c0._0_4_ = iVar3;
    for (lVar12 = 0; lVar12 < (int)local_3c0; lVar12 = lVar12 + 1) {
      local_3cc.str = *&pDVar6[lVar12 * 2].str;
      local_3d0.str = *&pDVar6[lVar12 * 2 + 1].str;
      WavingSketch<8U,_16U,_4U>::Init((WavingSketch<8U,_16U,_4U> *)&local_350,&local_3cc,&local_3d0)
      ;
    }
    lVar8 = std::chrono::_V2::system_clock::now();
    printf("\x1b[0m\x1b[1;36m|\x1b[0m\t");
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_350.super_Abstract<4U>.name._M_dataplus._M_p,
                        local_350.super_Abstract<4U>.name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_350.super_Abstract<4U>.sep._M_dataplus._M_p,
               local_350.super_Abstract<4U>.sep._M_string_length);
    dVar13 = (double)(int)lVar12 / ((double)(lVar8 - lVar7) / 1000.0);
    poVar5 = std::ostream::_M_insert<double>(dVar13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    poVar5 = std::ostream::_M_insert<double>(dVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    free(pDVar6);
    WavingSketch<8U,_16U,_4U>::~WavingSketch((WavingSketch<8U,_16U,_4U> *)&local_350);
    TLF<4U>::TLF(&local_350,SUB84(local_3c8,0),0x54);
    pDVar6 = read_standard_pair_data<4u>
                       ((local_3a0->_M_dataplus)._M_p,record_length,(int *)&local_3c0);
    lVar7 = std::chrono::_V2::system_clock::now();
    if (9999999 < (int)local_3c0) {
      local_3c0._0_4_ = 10000000;
    }
    for (lVar12 = 0; lVar12 < (int)local_3c0; lVar12 = lVar12 + 1) {
      local_3cc.str = *&pDVar6[lVar12 * 2].str;
      local_3d0.str = *&pDVar6[lVar12 * 2 + 1].str;
      TLF<4U>::Init(&local_350,&local_3cc,&local_3d0);
    }
    lVar8 = std::chrono::_V2::system_clock::now();
    printf("\x1b[0m\x1b[1;36m|\x1b[0m\t");
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_350.super_Abstract<4U>.name._M_dataplus._M_p,
                        local_350.super_Abstract<4U>.name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_350.super_Abstract<4U>.sep._M_dataplus._M_p,
               local_350.super_Abstract<4U>.sep._M_string_length);
    dVar13 = (double)(int)lVar12 / ((double)(lVar8 - lVar7) / 1000.0);
    poVar5 = std::ostream::_M_insert<double>(dVar13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    poVar5 = std::ostream::_M_insert<double>(dVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    free(pDVar6);
    TLF<4U>::~TLF(&local_350);
    OLF<4U>::OLF((OLF<4U> *)&local_350,SUB84(local_3c8,0),0x54);
    pDVar6 = read_standard_pair_data<4u>
                       ((local_3a0->_M_dataplus)._M_p,record_length,(int *)&local_3c0);
    lVar7 = std::chrono::_V2::system_clock::now();
    if (9999999 < (int)local_3c0) {
      local_3c0._0_4_ = 10000000;
    }
    for (lVar12 = 0; lVar12 < (int)local_3c0; lVar12 = lVar12 + 1) {
      local_3cc.str = *&pDVar6[lVar12 * 2].str;
      local_3d0.str = *&pDVar6[lVar12 * 2 + 1].str;
      OLF<4U>::Init((OLF<4U> *)&local_350,&local_3cc,&local_3d0);
    }
    lVar8 = std::chrono::_V2::system_clock::now();
    printf("\x1b[0m\x1b[1;36m|\x1b[0m\t");
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_350.super_Abstract<4U>.name._M_dataplus._M_p,
                        local_350.super_Abstract<4U>.name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_350.super_Abstract<4U>.sep._M_dataplus._M_p,
               local_350.super_Abstract<4U>.sep._M_string_length);
    dVar13 = (double)(int)lVar12 / ((double)(lVar8 - lVar7) / 1000.0);
    poVar5 = std::ostream::_M_insert<double>(dVar13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    poVar5 = std::ostream::_M_insert<double>(dVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    free(pDVar6);
    OLF<4U>::~OLF((OLF<4U> *)&local_350);
    OpenSketch<4U>::OpenSketch((OpenSketch<4U> *)&local_350,SUB84(local_3c8,0),0x54);
    pDVar6 = read_standard_pair_data<4u>
                       ((local_3a0->_M_dataplus)._M_p,record_length,(int *)&local_3c0);
    lVar7 = std::chrono::_V2::system_clock::now();
    if (9999999 < (int)local_3c0) {
      local_3c0._0_4_ = 10000000;
    }
    for (lVar12 = 0; lVar12 < (int)local_3c0; lVar12 = lVar12 + 1) {
      local_3cc.str = *&pDVar6[lVar12 * 2].str;
      local_3d0.str = *&pDVar6[lVar12 * 2 + 1].str;
      OpenSketch<4U>::Init((OpenSketch<4U> *)&local_350,&local_3cc,&local_3d0);
    }
    lVar8 = std::chrono::_V2::system_clock::now();
    printf("\x1b[0m\x1b[1;36m|\x1b[0m\t");
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_350.super_Abstract<4U>.name._M_dataplus._M_p,
                        local_350.super_Abstract<4U>.name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_350.super_Abstract<4U>.sep._M_dataplus._M_p,
               local_350.super_Abstract<4U>.sep._M_string_length);
    dVar13 = (double)(int)lVar12 / ((double)(lVar8 - lVar7) / 1000.0);
    poVar5 = std::ostream::_M_insert<double>(dVar13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    poVar5 = std::ostream::_M_insert<double>(dVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    free(pDVar6);
    OpenSketch<4U>::~OpenSketch((OpenSketch<4U> *)&local_350);
    SpreadSketchWrapper<4U>::SpreadSketchWrapper
              ((SpreadSketchWrapper<4U> *)&local_350,SUB84(local_3c8,0),0x54);
    pDVar6 = read_standard_pair_data<4u>
                       ((local_3a0->_M_dataplus)._M_p,record_length,(int *)&local_3c0);
    lVar7 = std::chrono::_V2::system_clock::now();
    if (9999999 < (int)local_3c0) {
      local_3c0._0_4_ = 10000000;
    }
    for (lVar12 = 0; lVar12 < (int)local_3c0; lVar12 = lVar12 + 1) {
      local_3cc.str = *&pDVar6[lVar12 * 2].str;
      local_3d0.str = *&pDVar6[lVar12 * 2 + 1].str;
      DetectorSS::Update((DetectorSS *)local_350.epsilon,(key_tp)local_3cc.str,(key_tp)local_3d0.str
                         ,1);
    }
    lVar8 = std::chrono::_V2::system_clock::now();
    local_3c8 = (double)(lVar8 - lVar7) / 1000.0;
    printf("\x1b[0m\x1b[1;36m|\x1b[0m\t");
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_350.super_Abstract<4U>.name._M_dataplus._M_p,
                        local_350.super_Abstract<4U>.name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_350.super_Abstract<4U>.sep._M_dataplus._M_p,
               local_350.super_Abstract<4U>.sep._M_string_length);
    local_3c8 = (double)(int)lVar12 / local_3c8;
    poVar5 = std::ostream::_M_insert<double>(local_3c8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    poVar5 = std::ostream::_M_insert<double>(local_3c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    free(pDVar6);
    SpreadSketchWrapper<4U>::~SpreadSketchWrapper((SpreadSketchWrapper<4U> *)&local_350);
    std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + (char)&local_230);
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    iVar3 = local_394 + 1;
  } while (iVar3 != 5);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _log;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if (local_370[0] != local_360) {
    operator_delete(local_370[0],local_360[0] + 1);
  }
  return;
}

Assistant:

void SuperSpread_Test_Speed(string PATH) {
	const int CYCLE = 1;
	Data<DATA_LEN> from;
	Data<DATA_LEN> to;
	std::string file = "caida";
	std::ofstream out(RESULT_FOLDER + "superSpread_" + file + "_Throughput(Mops).csv");
	for (int i = 0; i < 5; ++i) {
		int memory = 6 * SuperSpread_BLOCK + SuperSpread_BLOCK * i;
		printf("\033[0m\033[1;4;36m> Memory size: %dKB\n\033[0m", memory / 1000);

		if (i == 0)
		{
			out << "MEM(KB)" << "," << "WavingSketch<8,1>" << "," << "TLF" << ","
				<< "OLF" << "," << "opensketch" << "," << "SpreadSketch";
			out << std::endl;
		}
		out << memory / 1000 << ",";

		for (int k = 0; k < CYCLE; ++k) {
			WavingSketch<8, 16, DATA_LEN> sketch(memory, SuperSpread_HIT);
			int cnt;
			Data<DATA_LEN>* records = read_standard_pair_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
			int num = 0;

			TP start = now();
			cnt = std::min(cnt, MAX_PACKET);
			while (num < cnt) {
				from = records[num * 2];
				to = records[num * 2 + 1];
				++num;
				sketch.Init(from, to);
			}
			TP finish = now();

			double duration =
				(double)std::chrono::duration_cast<
				std::chrono::duration<double, std::ratio<1, 1000000>>>(finish -
					start)
				.count();
			printf("\033[0m\033[1;36m|\033[0m\t");
			cout << sketch.name << sketch.sep << (num + 0.0) / duration << endl;
			out << (num + 0.0) / duration << ",";
			free(records);
		}

		for (int k = 0; k < CYCLE; ++k) {
			TLF<DATA_LEN> sketch(memory, SuperSpread_HIT);
			int cnt;
			Data<DATA_LEN>* records = read_standard_pair_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
			int num = 0;

			TP start = now();
			cnt = std::min(cnt, MAX_PACKET);
			while (num < cnt) {
				from = records[num * 2];
				to = records[num * 2 + 1];
				++num;
				sketch.Init(from, to);
			}
			TP finish = now();

			double duration =
				(double)std::chrono::duration_cast<
				std::chrono::duration<double, std::ratio<1, 1000000>>>(finish -
					start)
				.count();
			printf("\033[0m\033[1;36m|\033[0m\t");
			cout << sketch.name << sketch.sep << (num + 0.0) / duration << endl;
			out << (num + 0.0) / duration << ",";
			free(records);
		}

		for (int k = 0; k < CYCLE; ++k) {
			OLF<DATA_LEN> sketch(memory, SuperSpread_HIT);
			int cnt;
			Data<DATA_LEN>* records = read_standard_pair_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
			int num = 0;

			TP start = now();
			cnt = std::min(cnt, MAX_PACKET);
			while (num < cnt) {
				from = records[num * 2];
				to = records[num * 2 + 1];
				++num;
				sketch.Init(from, to);
			}
			TP finish = now();

			double duration =
				(double)std::chrono::duration_cast<
				std::chrono::duration<double, std::ratio<1, 1000000>>>(finish -
					start)
				.count();
			printf("\033[0m\033[1;36m|\033[0m\t");
			cout << sketch.name << sketch.sep << (num + 0.0) / duration << endl;
			out << (num + 0.0) / duration << ",";
			free(records);
		}

		for (int k = 0; k < CYCLE; ++k) {
			OpenSketch<DATA_LEN> sketch(memory, SuperSpread_HIT);
			int cnt;
			Data<DATA_LEN>* records = read_standard_pair_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
			int num = 0;

			TP start = now();
			cnt = std::min(cnt, MAX_PACKET);
			while (num < cnt) {
				from = records[num * 2];
				to = records[num * 2 + 1];
				++num;
				sketch.Init(from, to);
			}
			TP finish = now();

			double duration =
				(double)std::chrono::duration_cast<
				std::chrono::duration<double, std::ratio<1, 1000000>>>(finish -
					start)
				.count();
			printf("\033[0m\033[1;36m|\033[0m\t");
			cout << sketch.name << sketch.sep << (num + 0.0) / duration << endl;
			out << (num + 0.0) / duration << ",";
			free(records);
		}

		for (int k = 0; k < CYCLE; ++k) {
			SpreadSketchWrapper<DATA_LEN> sketch(memory, SuperSpread_HIT);
			int cnt;
			Data<DATA_LEN>* records = read_standard_pair_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
			int num = 0;

			TP start = now();
			cnt = std::min(cnt, MAX_PACKET);
			while (num < cnt) {
				from = records[num * 2];
				to = records[num * 2 + 1];
				++num;
				sketch.Init(from, to);
			}
			TP finish = now();

			double duration =
				(double)std::chrono::duration_cast<
				std::chrono::duration<double, std::ratio<1, 1000000>>>(finish -
					start)
				.count();
			printf("\033[0m\033[1;36m|\033[0m\t");
			cout << sketch.name << sketch.sep << (num + 0.0) / duration << endl;
			out << (num + 0.0) / duration << ",";
			free(records);
		}
		out << endl;
	}
}